

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double frechet_pdf(double x,double alpha)

{
  double dVar1;
  double dVar2;
  
  if (0.0 < alpha) {
    dVar1 = pow(x,alpha);
    dVar1 = exp(-1.0 / dVar1);
    dVar2 = pow(x,alpha + 1.0);
    return (dVar1 * alpha) / dVar2;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"FRECHET_PDF - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  ALPHA <= 0.0.\n");
  exit(1);
}

Assistant:

double frechet_pdf ( double x, double alpha )

//****************************************************************************80
//
//  Purpose:
//
//    FRECHET_PDF evaluates the Frechet PDF.
//
//  Discussion:
//
//    PDF(X) = ALPHA * exp ( -1 / X^ALPHA ) / X^(ALPHA+1)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 September 2008
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double ALPHA, the parameter.
//    It is required that 0.0 < ALPHA.
//
//    Output, double PDF, the value of the PDF.
//
{
  double pdf;

  if ( alpha <= 0.0 )
  {
    cerr << "\n";
    cerr << "FRECHET_PDF - Fatal error!\n";
    cerr << "  ALPHA <= 0.0.\n";
    exit ( 1 );
  }

  pdf = alpha * exp ( - 1.0 / pow ( x, alpha ) ) / pow ( x, alpha + 1.0 );

  return pdf;
}